

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.hpp
# Opt level: O2

void ear::_assert_impl(bool condition,char *message)

{
  internal_error *this;
  undefined7 in_register_00000039;
  allocator<char> local_39;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000039,condition) != 0) {
    return;
  }
  this = (internal_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,message,&local_39);
  internal_error::internal_error(this,&local_38);
  __cxa_throw(this,&internal_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void _assert_impl(bool condition, const char *message) {
    if (!condition) throw internal_error(message);
  }